

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::impl::hmac_cipher::hmac_cipher(hmac_cipher *this,string *hash_name,key *k)

{
  size_t sVar1;
  cppcms_error *this_00;
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff78;
  encryptor *in_stack_ffffffffffffff80;
  key *in_stack_ffffffffffffff88;
  allocator *paVar2;
  key *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [56];
  string *local_10;
  
  local_10 = in_RSI;
  encryptor::encryptor(in_stack_ffffffffffffff80);
  *in_RDI = &PTR_encrypt_0052f288;
  crypto::key::key(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::string((string *)(in_RDI + 3),local_10);
  sVar1 = crypto::key::size((key *)(in_RDI + 1));
  if (sVar1 < 0x10) {
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    paVar2 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "The key legth is too small, use at leaset the key of 16 bytes/32 hexadecimal digits"
               ,paVar2);
    cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff78);
    __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  return;
}

Assistant:

hmac_cipher::hmac_cipher(std::string const &hash_name,crypto::key const &k) :
	key_(k),
	hash_(hash_name)
{
	if(key_.size() < 16) {
		throw cppcms_error("The key legth is too small, use at leaset the key of 16 bytes/32 hexadecimal digits");
	}
}